

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

QByteArray * __thiscall QHttpNetworkRequest::uri(QHttpNetworkRequest *this,bool throughProxy)

{
  bool bVar1;
  FormattingOptions f;
  QHttpNetworkRequestPrivate *pQVar2;
  byte in_DL;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  QByteArray *uri;
  char16_t *str;
  QUrl copy;
  FormattingOptions format;
  undefined4 in_stack_ffffffffffffff38;
  ComponentFormattingOption in_stack_ffffffffffffff3c;
  uint uVar3;
  QArrayDataPointer<char16_t> *this_00;
  QArrayDataPointer<char16_t> local_68;
  undefined1 local_50 [32];
  undefined1 local_30 [24];
  QUrl local_18;
  int local_10;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = -0x55555556;
  this_00 = in_RDI;
  local_10 = (int)::operator|((UrlFormattingOption)((ulong)in_RDI >> 0x20),
                              (UrlFormattingOption)in_RDI);
  local_c = QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator|
                      ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *)
                       this_00,in_stack_ffffffffffffff3c);
  pQVar2 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                     ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)0x3095bf);
  if ((pQVar2->operation == Post) &&
     (pQVar2 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                         ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)0x3095d3),
     pQVar2->uploadByteDevice == (QNonContiguousByteDevice *)0x0)) {
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator|=
              (&local_c,RemoveQuery);
  }
  if ((in_DL & 1) == 0) {
    f = ::operator|((UrlFormattingOption)((ulong)this_00 >> 0x20),(UrlFormattingOption)this_00);
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator|=
              (&local_c,(QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>)
                        f.i);
  }
  local_18.d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
  pQVar2 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
                     ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)0x309637);
  QUrl::QUrl(&local_18,(QUrl *)&(pQVar2->super_QHttpNetworkHeaderPrivate).url);
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)this_00,in_stack_ffffffffffffff3c);
  QUrl::path((QFlags_conflict *)local_30);
  bVar1 = QString::isEmpty((QString *)0x309686);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff3c);
  QString::~QString((QString *)0x309697);
  if ((uVar3 & 0x1000000) == 0) {
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator|=
              (&local_c,NormalizePathSegments);
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_68,(Data *)0x0,L"/",1);
    QString::QString((QString *)this_00,(DataPointer *)CONCAT44(uVar3,in_stack_ffffffffffffff38));
    QUrl::setPath((QString *)&local_18,(ParsingMode)local_50);
    QString::~QString((QString *)0x309709);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
  }
  ((DataPointer *)&this_00->d)->d = (Data *)0xaaaaaaaaaaaaaaaa;
  this_00->ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  this_00->size = -0x5555555555555556;
  QUrl::toEncoded((QUrlTwoFlags_conflict1 *)this_00);
  QUrl::~QUrl(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)in_RDI;
}

Assistant:

QByteArray QHttpNetworkRequest::uri(bool throughProxy) const
{
    QUrl::FormattingOptions format(QUrl::RemoveFragment | QUrl::RemoveUserInfo | QUrl::FullyEncoded);

    // for POST, query data is sent as content
    if (d->operation == QHttpNetworkRequest::Post && !d->uploadByteDevice)
        format |= QUrl::RemoveQuery;
    // for requests through proxy, the Request-URI contains full url
    if (!throughProxy)
        format |= QUrl::RemoveScheme | QUrl::RemoveAuthority;
    QUrl copy = d->url;
    if (copy.path().isEmpty())
        copy.setPath(QStringLiteral("/"));
    else
        format |= QUrl::NormalizePathSegments;
    QByteArray uri = copy.toEncoded(format);
    return uri;
}